

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void __thiscall ast::Section::read_block(Section *this,uint offset,uint8_t *buffer,uint size)

{
  uint uVar1;
  size_t __n;
  uint8_t *__src;
  size_t fill_offset;
  
  uVar1 = this->content_capacity;
  __n = (size_t)(uVar1 - offset);
  if (offset <= uVar1 && uVar1 - offset != 0) {
    if (uVar1 < size + offset) {
      memset(buffer + __n,0x55,size - __n);
      __src = this->content + offset;
    }
    else {
      __src = this->content + offset;
      __n = (size_t)size;
    }
    memcpy(buffer,__src,__n);
    return;
  }
  memset(buffer,0x55,(ulong)size);
  return;
}

Assistant:

void Section::read_block(unsigned offset, uint8_t *buffer, unsigned size)
{
	if (offset >= content_capacity)
		memset(buffer, 0x55, size);
	else if (offset + size > content_capacity) {
		size_t fill_offset = content_capacity - offset;
		size_t fill_size = size - fill_offset;
		memset(buffer + fill_offset, 0x55, fill_size);
		memcpy(buffer, content + offset, fill_offset);
	}
	else
		memcpy(buffer, content + offset, size);
}